

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O0

MomentData * __thiscall
OpenMD::LDForceModifier::getMomentData(LDForceModifier *this,StuntDouble *sd)

{
  bool bVar1;
  pointer ppVar2;
  MomentData *pMVar3;
  undefined8 uVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>
  *this_00;
  StuntDouble *in_RSI;
  long in_RDI;
  RealType mass;
  iterator i;
  MomentData *moment;
  iterator j;
  HydroProp *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  value_type *in_stack_fffffffffffffc38;
  MomentData *in_stack_fffffffffffffc40;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffc50;
  RectMatrix<double,_3U,_3U> *m1;
  SquareMatrix3<double> *in_stack_fffffffffffffcc8;
  string local_328 [288];
  RectMatrix<double,_3U,_3U> local_208;
  RectMatrix<double,_3U,_3U> local_1c0;
  RectMatrix<double,_3U,_3U> local_178 [2];
  RectMatrix<double,_3U,_3U> *local_e8;
  string local_c8 [56];
  _Self local_90;
  string local_88 [32];
  _Self local_68;
  MomentData *local_60;
  _Self local_58 [3];
  string local_40 [32];
  _Self local_20;
  StuntDouble *local_18;
  MomentData *local_8;
  
  local_18 = in_RSI;
  (*in_RSI->_vptr_StuntDouble[7])();
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
               *)in_stack_fffffffffffffc28,(key_type *)0x385719);
  std::__cxx11::string::~string(local_40);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
              *)in_stack_fffffffffffffc28);
  bVar1 = std::operator!=(&local_20,local_58);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>
                           *)0x385781);
    local_8 = ppVar2->second;
  }
  else {
    pMVar3 = (MomentData *)operator_new(0xa8);
    MomentData::MomentData(in_stack_fffffffffffffc40);
    local_60 = pMVar3;
    (*local_18->_vptr_StuntDouble[7])();
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                 *)in_stack_fffffffffffffc28,(key_type *)0x38581f);
    std::__cxx11::string::~string(local_88);
    local_90._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                *)in_stack_fffffffffffffc28);
    bVar1 = std::operator!=(&local_68,&local_90);
    if (bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>
                    *)0x385884);
      HydroProp::getCenterOfResistance(in_stack_fffffffffffffc28);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                 (Vector3<double> *)in_stack_fffffffffffffc28);
    }
    else {
      (*local_18->_vptr_StuntDouble[7])(local_c8);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "LDForceManager createMomentData: Couldn\'t find HydroProp for\nobject type %s!\n",
               uVar4);
      std::__cxx11::string::~string(local_c8);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    bVar1 = StuntDouble::isRigidBody(local_18);
    if (bVar1) {
      if (local_18 != (StuntDouble *)0x0) {
        __dynamic_cast(local_18,&StuntDouble::typeinfo,&RigidBody::typeinfo,0);
      }
      RigidBody::getRefCOM((RigidBody *)in_stack_fffffffffffffc28);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30)
                 ,(Vector<double,_3U> *)in_stack_fffffffffffffc28);
    }
    local_e8 = (RectMatrix<double,_3U,_3U> *)StuntDouble::getMass(local_18);
    (*local_18->_vptr_StuntDouble[5])();
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (SquareMatrix3<double> *)in_stack_fffffffffffffc28);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x385a43);
    m1 = local_e8;
    dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffc40,
                   (Vector<double,_3U> *)in_stack_fffffffffffffc38);
    SquareMatrix<double,_3>::identity();
    OpenMD::operator*((double)m1,in_stack_fffffffffffffc50);
    outProduct<double>((Vector3<double> *)m1,(Vector3<double> *)in_stack_fffffffffffffc50);
    OpenMD::operator+(m1,in_stack_fffffffffffffc50);
    OpenMD::operator*((double)m1,in_stack_fffffffffffffc50);
    RectMatrix<double,_3U,_3U>::operator+=
              ((RectMatrix<double,_3U,_3U> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffc28);
    RectMatrix<double,_3U,_3U>::~RectMatrix(local_178);
    RectMatrix<double,_3U,_3U>::~RectMatrix(&local_1c0);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x385b2c);
    RectMatrix<double,_3U,_3U>::~RectMatrix(&local_208);
    SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x385b46);
    SquareMatrix3<double>::inverse(in_stack_fffffffffffffcc8);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (SquareMatrix3<double> *)in_stack_fffffffffffffc28);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x385b89);
    this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>
               *)(in_RDI + 0x58);
    (*local_18->_vptr_StuntDouble[7])();
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*&,_true>
              (this_00,&in_stack_fffffffffffffc38->first,
               (MomentData **)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
    ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
              *)this_00,in_stack_fffffffffffffc38);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>
             *)0x385c16);
    std::__cxx11::string::~string(local_328);
    local_8 = local_60;
  }
  return local_8;
}

Assistant:

MomentData* LDForceModifier::getMomentData(StuntDouble* sd) {
    map<string, MomentData*>::iterator j = momentsMap_.find(sd->getType());
    if (j != momentsMap_.end()) {
      return j->second;
    } else {
      MomentData* moment                  = new MomentData;
      map<string, HydroProp*>::iterator i = hydroPropMap_.find(sd->getType());

      if (i != hydroPropMap_.end()) {
        // Center of Resistance:
        moment->rcr = i->second->getCenterOfResistance();
      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "LDForceManager createMomentData: Couldn't find HydroProp for\n"
            "object type %s!\n",
            sd->getType().c_str());
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      }

      if (sd->isRigidBody())
        moment->rcr -= dynamic_cast<RigidBody*>(sd)->getRefCOM();

      // Parallel axis formula to get the moment of inertia around
      // the center of resistance:
      RealType mass = sd->getMass();
      moment->Icr   = sd->getI();
      moment->Icr +=
          mass * (dot(moment->rcr, moment->rcr) * Mat3x3d::identity() +
                  outProduct(moment->rcr, moment->rcr));
      moment->IcrInv = moment->Icr.inverse();

      momentsMap_.insert(
          map<string, MomentData*>::value_type(sd->getType(), moment));
      return moment;
    }
  }